

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

Breakdown * __thiscall
absl::Time::In(Breakdown *__return_storage_ptr__,Time *this,int_least64_t param_3)

{
  uint32_t uVar1;
  weekday wVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  civil_second local_68;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tp;
  absolute_lookup al;
  
  tp.__d.__r = *(duration *)&(this->rep_).rep_hi_;
  uVar1 = (this->rep_).rep_lo_;
  if (uVar1 == 0xffffffff && (HiRep)tp.__d.__r == (HiRep)0x7fffffffffffffff) {
    __return_storage_ptr__->year = 0x7fffffffffffffff;
    __return_storage_ptr__->month = 0xc;
    __return_storage_ptr__->day = 0x1f;
    __return_storage_ptr__->hour = 0x17;
    __return_storage_ptr__->minute = 0x3b;
    __return_storage_ptr__->second = 0x3b;
    (__return_storage_ptr__->subsecond).rep_hi_.lo_ = 0xffffffff;
    (__return_storage_ptr__->subsecond).rep_hi_.hi_ = 0x7fffffff;
    iVar3 = 4;
    iVar5 = 0x16d;
  }
  else {
    if ((HiRep)tp.__d.__r != (HiRep)0x8000000000000000 || uVar1 != 0xffffffff) {
      local_68.f_.y = param_3;
      time_internal::cctz::time_zone::lookup(&al,(time_zone *)&local_68,&tp);
      uVar4 = al.cs.f_._8_4_ & 0xffff;
      __return_storage_ptr__->year = al.cs.f_.y;
      __return_storage_ptr__->month = (int)al.cs.f_.m;
      __return_storage_ptr__->day = (int)al.cs.f_.d;
      __return_storage_ptr__->hour = (int)al.cs.f_.hh;
      __return_storage_ptr__->minute = (int)al.cs.f_._8_4_ >> 0x18;
      __return_storage_ptr__->second = al.cs.f_._9_4_ >> 0x18;
      uVar1 = (this->rep_).rep_lo_;
      (__return_storage_ptr__->subsecond).rep_hi_.lo_ = 0;
      (__return_storage_ptr__->subsecond).rep_hi_.hi_ = 0;
      (__return_storage_ptr__->subsecond).rep_lo_ = uVar1;
      local_68.f_.y = al.cs.f_.y;
      local_68.f_.ss = '\0';
      local_68.f_._8_4_ = uVar4;
      wVar2 = time_internal::cctz::detail::get_weekday(&local_68);
      iVar3 = 1;
      if (wVar2 - tuesday < 6) {
        iVar3 = wVar2 + tuesday;
      }
      __return_storage_ptr__->weekday = iVar3;
      local_68.f_.y = al.cs.f_.y;
      local_68.f_.ss = '\0';
      local_68.f_._8_4_ = uVar4;
      iVar3 = time_internal::cctz::detail::get_yearday(&local_68);
      __return_storage_ptr__->yearday = iVar3;
      __return_storage_ptr__->offset = al.offset;
      __return_storage_ptr__->is_dst = al.is_dst;
      goto LAB_001664b8;
    }
    __return_storage_ptr__->year = -0x8000000000000000;
    __return_storage_ptr__->month = 1;
    __return_storage_ptr__->day = 1;
    __return_storage_ptr__->hour = 0;
    __return_storage_ptr__->minute = 0;
    __return_storage_ptr__->second = 0;
    (__return_storage_ptr__->subsecond).rep_hi_.lo_ = 0;
    (__return_storage_ptr__->subsecond).rep_hi_.hi_ = 0x80000000;
    iVar3 = 7;
    iVar5 = 1;
  }
  (__return_storage_ptr__->subsecond).rep_lo_ = 0xffffffff;
  __return_storage_ptr__->weekday = iVar3;
  __return_storage_ptr__->yearday = iVar5;
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->is_dst = false;
  al.abbr = "-00";
LAB_001664b8:
  __return_storage_ptr__->zone_abbr = al.abbr;
  return __return_storage_ptr__;
}

Assistant:

ABSL_INTERNAL_DISABLE_DEPRECATED_DECLARATION_WARNING
absl::Time::Breakdown Time::In(absl::TimeZone tz) const {
  if (*this == absl::InfiniteFuture()) return InfiniteFutureBreakdown();
  if (*this == absl::InfinitePast()) return InfinitePastBreakdown();

  const auto tp = unix_epoch() + cctz::seconds(time_internal::GetRepHi(rep_));
  const auto al = cctz::time_zone(tz).lookup(tp);
  const auto cs = al.cs;
  const auto cd = cctz::civil_day(cs);

  absl::Time::Breakdown bd;
  bd.year = cs.year();
  bd.month = cs.month();
  bd.day = cs.day();
  bd.hour = cs.hour();
  bd.minute = cs.minute();
  bd.second = cs.second();
  bd.subsecond = time_internal::MakeDuration(0, time_internal::GetRepLo(rep_));
  bd.weekday = MapWeekday(cctz::get_weekday(cd));
  bd.yearday = cctz::get_yearday(cd);
  bd.offset = al.offset;
  bd.is_dst = al.is_dst;
  bd.zone_abbr = al.abbr;
  return bd;
}